

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::addNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode **t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          bool *heightFlag)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  BSTNode *pBVar4;
  byte bVar5;
  bool bVar6;
  
  *heightFlag = false;
  pBVar4 = *t;
  if (pBVar4 == (BSTNode *)0x0) {
    pBVar4 = (BSTNode *)operator_new(0x40);
    (pBVar4->key)._M_dataplus._M_p = (pointer)0x0;
    (pBVar4->key)._M_string_length = 0;
    (pBVar4->key).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pBVar4->key).field_2 + 8) = 0;
    *(undefined8 *)&pBVar4->value = 0;
    pBVar4->left = (BSTNode *)0x0;
    pBVar4->right = (BSTNode *)0x0;
    *(undefined8 *)&pBVar4->bf = 0;
    (pBVar4->key)._M_dataplus._M_p = (pointer)&(pBVar4->key).field_2;
    (pBVar4->key)._M_string_length = 0;
    (pBVar4->key).field_2._M_local_buf[0] = '\0';
    *t = pBVar4;
    std::__cxx11::string::_M_assign((string *)pBVar4);
    pBVar4 = *t;
    pBVar4->value = 0;
    pBVar4->bf = 0;
    pBVar4->right = (BSTNode *)0x0;
    (*t)->left = (BSTNode *)0x0;
    *heightFlag = true;
    this->nodeCount = this->nodeCount + 1;
  }
  else {
    iVar1 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,key,pBVar4);
    uVar2 = 0xffffffff;
    if ((char)iVar1 == '\0') {
      uVar2 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,pBVar4,key);
      uVar2 = uVar2 & 0xff;
    }
    if (uVar2 != 0) {
      if ((int)uVar2 < 0) {
        piVar3 = addNode(this,&(*t)->left,key,heightFlag);
        bVar5 = *heightFlag;
        uVar2 = -(uint)bVar5;
      }
      else {
        piVar3 = addNode(this,&(*t)->right,key,heightFlag);
        bVar5 = *heightFlag;
        uVar2 = (uint)bVar5;
      }
      updateBF(this,t,uVar2);
      if (bVar5 == 0) {
        bVar6 = false;
      }
      else {
        bVar6 = (*t)->bf != 0;
      }
      *heightFlag = bVar6;
      return piVar3;
    }
  }
  return &(*t)->value;
}

Assistant:

ValueType *addNode(BSTNode * & t, const KeyType & key, bool & heightFlag) {
      heightFlag = false;
      if (t == NULL)  {
         t = new BSTNode();
         t->key = key;
         t->value = ValueType();
         t->bf = BST_IN_BALANCE;
         t->left = t->right = NULL;
         heightFlag = true;
         nodeCount++;
         return &t->value;
      }
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      ValueType *vp = NULL;
      int bfDelta = BST_IN_BALANCE;
      if (sign < 0) {
         vp = addNode(t->left, key, heightFlag);
         if (heightFlag) bfDelta = BST_LEFT_HEAVY;
      } else {
         vp = addNode(t->right, key, heightFlag);
         if (heightFlag) bfDelta = BST_RIGHT_HEAVY;
      }
      updateBF(t, bfDelta);
      heightFlag = (bfDelta != 0 && t->bf != BST_IN_BALANCE);
      return vp;
   }